

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O2

string * formatFloatNumber(string *__return_storage_ptr__,string *number)

{
  long lVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,number);
  bVar5 = contain(&local_40,'.');
  if (!bVar5) {
    __assert_fail("contain(number, \'.\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/egor-baranov[P]Neko/helpers.hpp"
                  ,0x12d,"string formatFloatNumber(string)");
  }
  std::__cxx11::string::~string((string *)&local_40);
  pcVar2 = (number->_M_dataplus)._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar2,pcVar2 + number->_M_string_length);
  pcVar2 = (number->_M_dataplus)._M_p;
  sVar3 = number->_M_string_length;
  uVar7 = (int)sVar3 - 1;
  lVar6 = 0;
  do {
    if (sVar3 - 1 == lVar6) goto LAB_00107d32;
    if (pcVar2[lVar6] != '0') {
      uVar7 = (uint)lVar6;
      goto LAB_00107d32;
    }
    lVar1 = lVar6 + 1;
    lVar4 = lVar6 + 1;
    lVar6 = lVar1;
  } while (pcVar2[lVar4] != '.');
  uVar7 = (int)lVar1 - 1;
LAB_00107d32:
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(pcVar2,pcVar2 + sVar3);
  std::__cxx11::string::string((string *)&local_60,number);
  sliceString(__return_storage_ptr__,&local_60,0,~uVar7 + (int)number->_M_string_length);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

string formatFloatNumber(string number) {
	assert(contain(number, '.'));
	int zeroPostfix = 0;
	reverse(number.begin(), number.end());
	for (int i = 0; i < number.size() - 1; ++i) {
		if (number[i] == '0' and number[i + 1] != '.') {
			++zeroPostfix;
		} else break;
	}
	reverse(number.begin(), number.end());
	return sliceString(number, 0, number.size() - zeroPostfix - 1);
}